

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureLookUpSession_SessionFoundHelper::
~initiatorFixtureLookUpSession_SessionFoundHelper
          (initiatorFixtureLookUpSession_SessionFoundHelper *this)

{
  ~initiatorFixtureLookUpSession_SessionFoundHelper
            ((initiatorFixtureLookUpSession_SessionFoundHelper *)&this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LookUpSession_SessionFound)
{
  startLoggedOn();
  std::string delimSOH = "\x01";
  std::string header = "8=FIX.4.2" + delimSOH
      + "9=100" + delimSOH
      + "35=A" + delimSOH
      + "49=TW" + delimSOH
      + "56=ISLD" + delimSOH;

  Session* actualSession = object->lookupSession(header, false);
  CHECK(nullptr != actualSession);
}